

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O1

int load_ecc_key(SSL_CTX *ssl_ctx,EVP_PKEY *evp_key)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  iVar1 = SSL_CTX_use_PrivateKey((SSL_CTX *)ssl_ctx,(EVP_PKEY *)evp_key);
  iVar3 = 0;
  if (iVar1 != 1) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x80;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/x509_openssl.c"
                ,"load_ecc_key",0x7f,1,"Failed SSL_CTX_use_PrivateKey");
    }
  }
  return iVar3;
}

Assistant:

static int load_ecc_key(SSL_CTX* ssl_ctx, EVP_PKEY* evp_key)
{
    int result;
    /* Codes_SRS_X509_OPENSSL_07_004: [ x509_openssl_add_ecc_credentials shall import the certification using by the EVP_PKEY. ] */
    if (SSL_CTX_use_PrivateKey(ssl_ctx, evp_key) != 1)
    {
        LogError("Failed SSL_CTX_use_PrivateKey");
        result = MU_FAILURE;
    }
    else
    {
        result = 0;
    }
    /* Codes_SRS_X509_OPENSSL_07_007: [ If any failure is encountered x509_openssl_add_ecc_credentials shall return a non-zero value. ] */
    return result;
}